

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

int8_t __thiscall
icu_63::UnicodeString::doCompareCodePointOrder
          (UnicodeString *this,int32_t start,int32_t length,UChar *srcChars,int32_t srcStart,
          int32_t srcLength)

{
  UBool UVar1;
  int32_t iVar2;
  char16_t *pcVar3;
  UChar *local_58;
  int32_t local_30;
  int32_t diff;
  int32_t srcLength_local;
  int32_t srcStart_local;
  UChar *srcChars_local;
  int32_t length_local;
  int32_t start_local;
  UnicodeString *this_local;
  
  srcChars_local._0_4_ = length;
  srcChars_local._4_4_ = start;
  _length_local = this;
  UVar1 = isBogus(this);
  if (UVar1 == '\0') {
    pinIndices(this,(int32_t *)((long)&srcChars_local + 4),(int32_t *)&srcChars_local);
    local_30 = srcLength;
    diff = srcStart;
    if (srcChars == (UChar *)0x0) {
      local_30 = 0;
      diff = 0;
    }
    pcVar3 = getArrayStart(this);
    if (srcChars == (UChar *)0x0) {
      local_58 = (UChar *)0x0;
    }
    else {
      local_58 = srcChars + diff;
    }
    iVar2 = uprv_strCompare_63(pcVar3 + srcChars_local._4_4_,(int32_t)srcChars_local,local_58,
                               local_30,'\0','\x01');
    if (iVar2 == 0) {
      this_local._7_1_ = 0;
    }
    else {
      this_local._7_1_ = (byte)(iVar2 >> 0xf) | 1;
    }
  }
  else {
    this_local._7_1_ = 0xff;
  }
  return this_local._7_1_;
}

Assistant:

int8_t
UnicodeString::doCompareCodePointOrder(int32_t start,
                                       int32_t length,
                                       const UChar *srcChars,
                                       int32_t srcStart,
                                       int32_t srcLength) const
{
  // compare illegal string values
  // treat const UChar *srcChars==NULL as an empty string
  if(isBogus()) {
    return -1;
  }

  // pin indices to legal values
  pinIndices(start, length);

  if(srcChars == NULL) {
    srcStart = srcLength = 0;
  }

  int32_t diff = uprv_strCompare(getArrayStart() + start, length, (srcChars!=NULL)?(srcChars + srcStart):NULL, srcLength, FALSE, TRUE);
  /* translate the 32-bit result into an 8-bit one */
  if(diff!=0) {
    return (int8_t)(diff >> 15 | 1);
  } else {
    return 0;
  }
}